

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_> *
__thiscall slang::ast::Compilation::getPackages(Compilation *this)

{
  const_iterator __position;
  bool bVar1;
  vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  *this_00;
  type *ptVar2;
  long in_RSI;
  vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  *in_RDI;
  const_iterator cVar3;
  type *pkg;
  type *name;
  const_iterator __end2;
  const_iterator __begin2;
  flat_hash_map<std::string_view,_const_PackageSymbol_*> *__range2;
  vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  *result;
  iterator in_stack_ffffffffffffff48;
  borrowed_iterator_t<std::vector<const_slang::ast::PackageSymbol_*>_&> in_stack_ffffffffffffff50;
  vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  *pvVar4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar5;
  
  uVar5 = 0;
  pvVar4 = in_RDI;
  std::vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  ::vector((vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
            *)0x51e64e);
  this_00 = (vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
             *)(in_RSI + 0x2f8);
  cVar3 = boost::unordered::
          unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
          ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
                   *)0x51e66e);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
         *)0x51e68b);
  while (bVar1 = boost::unordered::detail::foa::operator!=
                           ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_ffffffffffffff50._M_current,
                            (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_ffffffffffffff48._M_current), bVar1) {
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)in_stack_ffffffffffffff50._M_current);
    ptVar2 = std::
             get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>
                       ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
                         *)0x51e6d9);
    std::
    get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
                *)0x51e6e8);
    in_stack_ffffffffffffff50 =
         std::ranges::__upper_bound_fn::
         operator()<std::vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:284:56),_std::ranges::less>
                   ((__upper_bound_fn *)&std::ranges::upper_bound,pvVar4,ptVar2);
    __gnu_cxx::
    __normal_iterator<slang::ast::PackageSymbol_const*const*,std::vector<slang::ast::PackageSymbol_const*,std::allocator<slang::ast::PackageSymbol_const*>>>
    ::__normal_iterator<slang::ast::PackageSymbol_const**>
              ((__normal_iterator<const_slang::ast::PackageSymbol_*const_*,_std::vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>_>
                *)in_stack_ffffffffffffff50._M_current,
               (__normal_iterator<const_slang::ast::PackageSymbol_**,_std::vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>_>
                *)in_stack_ffffffffffffff48._M_current);
    __position._M_current._7_1_ = uVar5;
    __position._M_current._0_7_ = in_stack_ffffffffffffffe8;
    in_stack_ffffffffffffff48 =
         std::
         vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
         ::insert(this_00,__position,(value_type *)cVar3.p_);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_stack_ffffffffffffff50._M_current);
  }
  return in_RDI;
}

Assistant:

std::vector<const PackageSymbol*> Compilation::getPackages() const {
    std::vector<const PackageSymbol*> result;
    for (auto& [name, pkg] : packageMap) {
        result.insert(
            std::ranges::upper_bound(result, name, {}, [](auto item) { return item->name; }), pkg);
    }
    return result;
}